

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

any __thiscall
cs_impl::cni_helper<cs::numeric_(*)(const_cs_impl::any_&),_cs::numeric_(*)(const_cs_impl::any_&)>::
call(cni_helper<cs::numeric_(*)(const_cs_impl::any_&),_cs::numeric_(*)(const_cs_impl::any_&)> *this,
    vector *args)

{
  runtime_error *this_00;
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *in_RDX;
  anon_union_16_2_310e9938_for_data local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (in_RDX[1] - *in_RDX != 8) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string(&local_a8,1);
    std::operator+(&local_40,"Wrong size of the arguments. Expected ",&local_a8);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
    local_c8._int = *plVar1;
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._int == paVar2) {
      local_b8._M_allocated_capacity = paVar2->_M_allocated_capacity;
      local_b8._8_8_ = plVar1[3];
      local_c8._int = (numeric_integer)&local_b8;
    }
    else {
      local_b8._M_allocated_capacity = paVar2->_M_allocated_capacity;
    }
    local_c8._8_8_ = plVar1[1];
    *plVar1 = (long)paVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::to_string(&local_60,in_RDX[1] - *in_RDX >> 3);
    std::operator+(&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8,
                   &local_60);
    cs::runtime_error::runtime_error(this_00,&local_88);
    __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
  if ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)args[1].super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
              super__Vector_impl_data._M_start)(&local_88);
    local_c8._int = (numeric_integer)local_88._M_dataplus._M_p;
    local_c8._8_8_ = local_88._M_string_length;
    local_b8._M_local_buf[0] = local_88.field_2._M_local_buf[0];
    any::make_constant<cs::numeric,cs::numeric_const&>((any *)this,(numeric *)&local_c8);
    return (any)(proxy *)this;
  }
  std::__throw_bad_function_call();
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			return return_to_cs(_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result));
		}